

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricKeyPair.cpp
# Opt level: O1

ByteString * __thiscall
AsymmetricKeyPair::serialise(ByteString *__return_storage_ptr__,AsymmetricKeyPair *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString local_b8;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  iVar1 = (*(this->super_Serialisable)._vptr_Serialisable[4])(this);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&local_40,(undefined8 *)CONCAT44(extraout_var,iVar1));
  ByteString::serialise(&local_68,&local_40);
  iVar1 = (*(this->super_Serialisable)._vptr_Serialisable[6])(this);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar1))
            (&local_b8,(undefined8 *)CONCAT44(extraout_var_00,iVar1));
  ByteString::serialise(&local_90,&local_b8);
  operator+(__return_storage_ptr__,&local_68,&local_90);
  local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_90.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_b8._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_68.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_40.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString AsymmetricKeyPair::serialise() const
{
	return getConstPublicKey()->serialise().serialise() + getConstPrivateKey()->serialise().serialise();
}